

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

size_t units::findOperatorSep(string *ustring,string *operators)

{
  char cVar1;
  undefined8 in_RAX;
  size_type sVar2;
  undefined4 uStack_28;
  int index;
  
  _uStack_28 = in_RAX;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operators,")}]");
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(ustring,operators,0xffffffffffffffff);
  while (sVar2 - 1 < 0xfffffffffffffffe) {
    cVar1 = (ustring->_M_dataplus)._M_p[sVar2];
    if (((cVar1 != ')') && (cVar1 != '}')) && (cVar1 != ']')) break;
    _uStack_28 = CONCAT44((int)sVar2 + -1,uStack_28);
    cVar1 = getMatchCharacter(cVar1);
    segmentcheckReverse(ustring,cVar1,&index);
    sVar2 = 0xffffffffffffffff;
    if (0 < (long)index) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of(ustring,operators,(long)index);
    }
  }
  return -(ulong)(sVar2 == 0) | sVar2;
}

Assistant:

static size_t findOperatorSep(const std::string& ustring, std::string operators)
{
    operators.append(")}]");
    auto sep = ustring.find_last_of(operators);

    while (
        sep != std::string::npos && sep > 0 &&
        (ustring[sep] == ')' || ustring[sep] == '}' || ustring[sep] == ']')) {
        int index = static_cast<int>(sep) - 1;
        segmentcheckReverse(ustring, getMatchCharacter(ustring[sep]), index);
        sep = (index > 0) ? ustring.find_last_of(operators, index) :
                            std::string::npos;
    }
    if (sep == 0) {
        // this should not happen
        // LCOV_EXCL_START
        sep = std::string::npos;
        // LCOV_EXCL_STOP
    }
    return sep;
}